

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::update_auto_sequential(torrent *this)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  unique_lock<std::mutex> local_30;
  
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_30._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar2) + 0x438);
  local_30._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  bVar1 = *(byte *)(CONCAT44(extraout_var,iVar2) + 0x430);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if ((bVar1 & 4) != 0) {
    iVar2 = (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                .
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_torrent_hot_members).m_connections.
                               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               .
                               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) -
            (int)((ulong)((long)(this->m_peers_to_disconnect).
                                super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_peers_to_disconnect).
                               super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
    if (9 < (int)(iVar2 - (uint)this->m_num_connecting)) {
      iVar3 = (uint)this->m_num_seeds - (uint)this->m_num_connecting_seeds;
      this->field_0x5cc =
           this->field_0x5cc & 0xfd |
           (9 < iVar3 &&
           (int)(((iVar2 - ((uint)this->m_num_connecting + (uint)this->m_num_seeds)) +
                 (uint)this->m_num_connecting_seeds) * 10) <= iVar3) * '\x02';
      return;
    }
  }
  this->field_0x5cc = this->field_0x5cc & 0xfd;
  return;
}

Assistant:

void torrent::update_auto_sequential()
	{
		if (!settings().get_bool(settings_pack::auto_sequential))
		{
			m_auto_sequential = false;
			return;
		}

		if (num_peers() - m_num_connecting < 10)
		{
			// there are too few peers. Be conservative and don't assume it's
			// well seeded until we can connect to more peers
			m_auto_sequential = false;
			return;
		}

		// if there are at least 10 seeds, and there are 10 times more
		// seeds than downloaders, enter sequential download mode
		// (for performance)
		int const downloaders = num_downloaders();
		int const seeds = num_seeds();
		m_auto_sequential = downloaders * 10 <= seeds
			&& seeds > 9;
	}